

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall n_e_s::core::Pipeline::append(Pipeline *this,Pipeline *pipeline)

{
  _Deque_iterator<std::function<n_e_s::core::StepResult_()>,_const_std::function<n_e_s::core::StepResult_()>_&,_const_std::function<n_e_s::core::StepResult_()>_*>
  local_40;
  _Deque_iterator<std::function<n_e_s::core::StepResult_()>,_const_std::function<n_e_s::core::StepResult_()>_&,_const_std::function<n_e_s::core::StepResult_()>_*>
  local_20;
  
  local_20._M_cur =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_20._M_first =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_20._M_last =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_20._M_node =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_40._M_cur =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_40._M_first =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_40._M_last =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_40._M_node =
       (pipeline->steps_).
       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  __copy_move_dit<false,std::function<n_e_s::core::StepResult()>,std::function<n_e_s::core::StepResult()>const&,std::function<n_e_s::core::StepResult()>const*,std::back_insert_iterator<std::deque<std::function<n_e_s::core::StepResult()>,std::allocator<std::function<n_e_s::core::StepResult()>>>>>
            (&local_20,&local_40,
             (back_insert_iterator<std::deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>_>
              )&this->steps_);
  return;
}

Assistant:

void Pipeline::append(const Pipeline &pipeline) {
    std::copy(pipeline.steps_.begin(),
            pipeline.steps_.end(),
            std::back_inserter(steps_));
}